

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O1

reference<mpt::pipe<int>::instance> * __thiscall mpt::pipe<int>::ref(pipe<int> *this)

{
  instance *piVar1;
  queue *this_00;
  long lVar2;
  
  if ((this->_d)._ref == (instance *)0x0) {
    this_00 = (queue *)operator_new(0x30);
    mpt::io::queue::queue(this_00,0);
    *(undefined8 *)(this_00 + 0x28) = 1;
    *(undefined ***)&this_00->field_0x0 = &PTR_write_00104ce8;
    piVar1 = (this->_d)._ref;
    if (piVar1 != (instance *)0x0) {
      lVar2 = mpt::refcount::lower();
      if (lVar2 == 0) {
        (**(code **)(*(long *)&piVar1->super_type + 0x38))(piVar1);
      }
    }
    (this->_d)._ref = (instance *)this_00;
  }
  return &this->_d;
}

Assistant:

const reference<instance> &ref()
	{
		if (!_d.instance()) {
			_d.set_instance(new instance);
		}
		return _d;
	}